

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O0

void test_open_address_hashmap_handler_function_registration(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  undefined1 local_60 [8];
  ion_dictionary_handler_t map_handler;
  planck_unit_test_t *tc_local;
  
  map_handler.close_dictionary = (_func_ion_err_t_ion_dictionary_t_ptr *)tc;
  oadict_init((ion_dictionary_handler_t *)local_60);
  pVar1 = planck_unit_assert_true
                    ((planck_unit_test_t *)map_handler.close_dictionary,
                     (uint)(local_60 == (undefined1  [8])oadict_insert),0x60,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    ((planck_unit_test_t *)map_handler.close_dictionary,
                     (uint)(map_handler.insert == oadict_create_dictionary),0x61,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    ((planck_unit_test_t *)map_handler.close_dictionary,
                     (uint)(map_handler.get == oadict_update),0x62,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    ((planck_unit_test_t *)map_handler.close_dictionary,
                     (uint)(map_handler.find == oadict_delete),99,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    ((planck_unit_test_t *)map_handler.close_dictionary,
                     (uint)(map_handler.remove == oadict_delete_dictionary),100,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  return;
}

Assistant:

void
test_open_address_hashmap_handler_function_registration(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t map_handler;	/* create handler for hashmap */

	oadict_init(&map_handler);	/* register handler for hashmap */

	/* check to ensure that function pointers are correctly registered */
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.insert == &oadict_insert);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.create_dictionary == &oadict_create_dictionary);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.update == &oadict_update);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.remove == &oadict_delete);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.delete_dictionary == &oadict_delete_dictionary);
}